

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O2

Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
* __thiscall
Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>
          (Option<std::tuple<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>,_unsigned_char>_>
           *__return_storage_ptr__,QKbo *this,Literal *literal)

{
  uint uVar1;
  TermList TVar2;
  Term *pTVar3;
  TermList *pTVar4;
  TermList TVar5;
  uint uVar6;
  anon_class_1_1_a83b8aa4 clsr;
  OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  local_40;
  
  uVar6 = (literal->super_Term)._functor;
  if (uVar6 == 0) {
LAB_0047973f:
    TVar2 = Term::termArg(&literal->super_Term,0);
    pTVar3 = NumTraits<Kernel::RealConstantType>::zeroT();
    uVar6 = (uint)((Term *)TVar2._content == pTVar3);
  }
  else {
    uVar1 = NumTraits<Kernel::RealConstantType>::geqF();
    if (uVar6 != uVar1) {
      uVar1 = NumTraits<Kernel::RealConstantType>::greaterF();
      if (uVar6 != uVar1) {
        TVar2 = Term::termArg(&literal->super_Term,0);
        clsr.level = ((literal->super_Term)._args[0]._content & 4) == 0 | 2;
        goto LAB_004797d8;
      }
    }
    uVar6 = 0;
    if ((literal->super_Term)._functor == 0) goto LAB_0047973f;
  }
  pTVar4 = AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
  TVar2 = Term::termArg(&literal->super_Term,uVar6 ^ 1);
  if (pTVar4->_content == TVar2._content) {
    TVar2 = Term::termArg(&literal->super_Term,uVar6);
  }
  else {
    TVar2 = Term::termArg(&literal->super_Term,0);
    TVar5 = Term::termArg(&literal->super_Term,1);
    TVar5 = NumTraits<Kernel::RealConstantType>::minus(TVar5);
    TVar2 = NumTraits<Kernel::RealConstantType>::add(TVar2,TVar5);
  }
  clsr.level = '\x01';
  if ((literal->super_Term)._functor == 0) {
    clsr.level = ((literal->super_Term)._args[0]._content & 4) == 0;
  }
LAB_004797d8:
  signedAtoms<Kernel::NumTraits<Kernel::RealConstantType>>
            ((Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)&local_40,this,TVar2);
  Lib::
  Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
  ::
  map<Kernel::QKbo::atomsWithLvl<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Literal*)const::_lambda(auto:1)_1_>
            (__return_storage_ptr__,&local_40,clsr);
  Lib::
  OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  ::~OptionBase(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Option<AtomsWithLvl> atomsWithLvl(Literal* literal) const
  {
    using ASig = AlascaSignature<NumTraits>;
    ASS(AlascaState::interpretedPred(literal))
    TermList term;
    uint8_t level;
    auto f = literal->functor();
    if (literal->isEquality() || f == NumTraits::geqF() || f == NumTraits::greaterF()) {
      auto mainIdx = literal->isEquality() && literal->termArg(0) == NumTraits::zero() ? 1 : 0;

      term = ASig::zero() == literal->termArg(1 - mainIdx) 
           ? literal->termArg(mainIdx)
           : NumTraits::add(literal->termArg(0), NumTraits::minus(literal->termArg(1)));

      level = literal->isEquality() 
        ? (literal->isPositive() ? POS_EQ_LEVEL : NEG_EQ_LEVEL)
        :  INEQ_LEVEL;
    } else {
      ASS(f == NumTraits::isIntF());
      term = literal->termArg(0);
      level = literal->isPositive() ? POS_IS_INT_LEVEL : NEG_IS_INT_LEVEL;
    }

    return signedAtoms<NumTraits>(term)
      .map([level](auto atoms) {
          return std::make_tuple(std::move(atoms), level);
      });
  }